

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O3

void __thiscall nv::FloatImage::initFrom(FloatImage *this,Image *img)

{
  ushort uVar1;
  ushort uVar2;
  Color32 CVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  float *pfVar7;
  anon_union_4_2_12391d8d_for_Color32_0 *paVar8;
  uint uVar9;
  ulong uVar10;
  
  if (img == (Image *)0x0) {
    iVar4 = nvAbort("img != __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/FloatImage.cpp"
                    ,0x45,"void nv::FloatImage::initFrom(const Image *)");
    if (iVar4 == 1) {
      raise(5);
    }
  }
  uVar5 = Image::width(img);
  uVar6 = Image::height(img);
  mem::free(this->m_mem);
  this->m_mem = (float *)0x0;
  this->m_width = (uint16)uVar5;
  this->m_height = (uint16)uVar6;
  this->m_componentNum = 4;
  uVar9 = uVar5 * uVar6 * 4;
  this->m_count = uVar9;
  pfVar7 = (float *)mem::malloc((ulong)uVar9 << 2);
  this->m_mem = pfVar7;
  uVar1 = this->m_width;
  uVar2 = this->m_height;
  uVar9 = (uint)uVar2 * (uint)uVar1;
  if (uVar9 != 0) {
    uVar10 = 0;
    do {
      paVar8 = &Image::pixel(img,(uint)uVar10)->field_0;
      CVar3.field_0 = (anon_union_4_2_12391d8d_for_Color32_0)paVar8->u;
      *pfVar7 = (float)((uint)CVar3.field_0 >> 0x10 & 0xff) / 255.0;
      pfVar7[(ulong)uVar2 * (ulong)uVar1] = (float)((uint)CVar3.field_0 >> 8 & 0xff) / 255.0;
      pfVar7[uVar9 * 2] = (float)((uint)CVar3.field_0 & 0xff) / 255.0;
      pfVar7[uVar9 * 3] = (float)((uint)CVar3.field_0 >> 0x18) / 255.0;
      uVar10 = uVar10 + 1;
      pfVar7 = pfVar7 + 1;
    } while (uVar9 != uVar10);
  }
  return;
}

Assistant:

void FloatImage::initFrom(const Image * img)
{
	nvCheck(img != NULL);
	
	allocate(4, img->width(), img->height());
	
	float * red_channel = channel(0);
	float * green_channel = channel(1);
	float * blue_channel = channel(2);
	float * alpha_channel = channel(3);
	
	const uint count = m_width * m_height;
	for(uint i = 0; i < count; i++) {
		Color32 pixel = img->pixel(i);
		red_channel[i] = float(pixel.r) / 255.0f;
		green_channel[i] = float(pixel.g) / 255.0f;
		blue_channel[i] = float(pixel.b) / 255.0f;
		alpha_channel[i] = float(pixel.a) / 255.0f;
	}
}